

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdi::ControlLabel::updateWindowIcon(ControlLabel *this)

{
  ulong uVar1;
  QStyle *pQVar2;
  QSize *this_00;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  int iconSize;
  QIcon menuIcon;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QIcon *in_stack_ffffffffffffff88;
  QPixmap *this_01;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QWidget *in_stack_ffffffffffffff98;
  QPixmap *this_02;
  QPixmap local_38 [8];
  QPixmap local_30 [24];
  QIcon local_18;
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QWidget::windowIcon(in_stack_ffffffffffffff98);
  uVar1 = QIcon::isNull();
  if ((uVar1 & 1) != 0) {
    pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                           );
    pQVar3 = QWidget::parentWidget((QWidget *)0x62a83a);
    (**(code **)(*(long *)pQVar2 + 0x100))(&local_18,pQVar2,0,0,pQVar3);
    QIcon::operator=((QIcon *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
    QIcon::~QIcon(&local_18);
  }
  this_00 = (QSize *)QWidget::style((QWidget *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pQVar3 = QWidget::parentWidget((QWidget *)0x62a886);
  (**(code **)((long)*this_00 + 0xe0))(this_00,0x5b,0,pQVar3);
  this_01 = local_38;
  QSize::QSize(this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  dVar4 = (double)QPaintDevice::devicePixelRatio();
  this_02 = local_30;
  QIcon::pixmap((QSize *)this_02,dVar4,(Mode)&local_10,(State)this_01);
  QPixmap::operator=(this_01,(QPixmap *)this_00);
  QPixmap::~QPixmap(this_02);
  QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  QIcon::~QIcon(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ControlLabel::updateWindowIcon()
{
    QIcon menuIcon = windowIcon();
    if (menuIcon.isNull())
        menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, parentWidget());
    const int iconSize = style()->pixelMetric(QStyle::PM_TitleBarButtonIconSize, nullptr, parentWidget());
    label = menuIcon.pixmap(QSize(iconSize, iconSize), devicePixelRatio());
    update();
}